

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qx509_openssl.cpp
# Opt level: O0

QString * __thiscall QTlsPrivate::X509CertificateOpenSSL::toText(X509CertificateOpenSSL *this)

{
  long in_RSI;
  QString *in_RDI;
  X509 *unaff_retaddr;
  
  if (*(long *)(in_RSI + 0x78) == 0) {
    QString::QString((QString *)0x138758);
  }
  else {
    anon_unknown_2::x509ToText(unaff_retaddr);
  }
  return in_RDI;
}

Assistant:

QString X509CertificateOpenSSL::toText() const
{
    if (!x509)
        return {};

    return x509ToText(x509);
}